

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createLightSource_infinite(SemanticParser *this,SP *in)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *this_00;
  ostream *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SP SVar5;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP light;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string local_e8 [36];
  undefined4 local_c4;
  string local_c0 [32];
  string local_a0 [8];
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff70;
  ParamSet *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff90;
  ParamSet *in_stack_ffffffffffffff98;
  _Self local_40;
  _Self local_38;
  ParamSet *local_30;
  
  __lhs_00 = in_RDI;
  std::make_shared<pbrt::InfiniteLightSource>();
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afe58);
  peVar4 = std::
           __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afe6e);
  memcpy(&peVar4->transform,&peVar3->transform,0x30);
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afe8e);
  local_30 = &(peVar3->super_Node).super_ParamSet;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffe88);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffe88);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"found infinite light source w/ map ");
      peVar4 = std::
               __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b02b7);
      __r = std::operator<<(this_00,(string *)&peVar4->mapName);
      std::ostream::operator<<(__r,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<pbrt::LightSource>::shared_ptr<pbrt::InfiniteLightSource,void>
                ((shared_ptr<pbrt::LightSource> *)this_00,
                 (shared_ptr<pbrt::InfiniteLightSource> *)__r);
      local_c4 = 1;
      std::shared_ptr<pbrt::InfiniteLightSource>::~shared_ptr
                ((shared_ptr<pbrt::InfiniteLightSource> *)0x1b030a);
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__lhs_00;
      return (SP)SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1afeef);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::__cxx11::string::string(local_a0,(string *)&stack0xffffffffffffff90);
    bVar1 = std::operator==(&in_stack_fffffffffffffe90->first,(char *)in_stack_fffffffffffffe88);
    if (bVar1) {
      std::
      __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1aff49);
      syntactic::ParamSet::getParamString(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      peVar4 = std::
               __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1aff74);
      std::__cxx11::string::operator=((string *)&peVar4->mapName,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffe90->first,(char *)in_stack_fffffffffffffe88);
      if (bVar1) {
        std::
        __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b001e);
        std::
        __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b0034);
        syntactic::ParamSet::getParam3f
                  (in_stack_ffffffffffffff78,(float *)in_stack_ffffffffffffff70,
                   (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffe90->first,(char *)in_stack_fffffffffffffe88)
        ;
        if (bVar1) {
          std::
          __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b008d);
          std::
          __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b00a3);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffff78,(float *)in_stack_ffffffffffffff70,
                     (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffffe90->first,
                                  (char *)in_stack_fffffffffffffe88);
          if (!bVar1) {
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x10);
            std::operator+((char *)__lhs_00,in_RDI);
            std::operator+(__lhs,(char *)in_stack_fffffffffffffe90);
            std::runtime_error::runtime_error((runtime_error *)__lhs,local_e8);
            __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b00fc);
          std::
          __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b0112);
          iVar2 = syntactic::ParamSet::getParam1i
                            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff6c);
          peVar4 = std::
                   __shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1b013d);
          peVar4->nSamples = iVar2;
        }
      }
    }
    local_c4 = 3;
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffe90);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffe90);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_infinite
  (pbrt::syntactic::LightSource::SP in)
  {
    InfiniteLightSource::SP light = std::make_shared<InfiniteLightSource>();
    // const std::string mapName = in->getParamString("mapname");
    // if (mapName == "")
    //   std::cerr << "warning: no 'mapname' in infinite lightsource!?" << std::endl;
    
    light->transform = in->transform.atStart;
    // light->mapName = mapName;

    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "mapname") {
        light->mapName = in->getParamString(name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "nsamples") {
        light->nSamples = in->getParam1i(name,light->nSamples);
        continue;
      }
      throw std::runtime_error("unknown 'infinite' light source param '"+name+"'");
    }

    std::cout << "found infinite light source w/ map " << light->mapName << std::endl;
    return light;
  }